

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O2

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>>,Eigen::internal::assign_op<double,double>>
               (Matrix<double,__1,__1,_1,__1,__1> *dst,
               CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
               *src,assign_op<double,_double> *func)

{
  DstEvaluatorType dstEvaluator;
  SrcEvaluatorType srcEvaluator;
  Kernel kernel;
  DstEvaluatorType local_58;
  SrcEvaluatorType local_48;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_38;
  
  local_48.m_functor.m_other = (src->m_functor).m_other;
  resize_if_allowed<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>>,double,double>
            (dst,src,func);
  local_58.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>.m_d.
  data = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_data;
  local_58.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>.m_d.
  m_outerStride =
       (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_cols;
  local_38.m_dst = &local_58;
  local_38.m_src = &local_48;
  local_38.m_functor = func;
  local_38.m_dstExpr = dst;
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_3,_0>
  ::run(&local_38);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);
    
  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}